

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,uint32_t tag,NodeBase *node,
               MapAuxInfo map_info)

{
  uint8_t *puVar1;
  ulong uVar2;
  ZeroCopyOutputStream **ppZVar3;
  bool bVar4;
  byte bVar5;
  char *pcVar6;
  string *psVar7;
  int line;
  int size;
  string serialized;
  void *data;
  CodedOutputStream coded_output;
  StringOutputStream string_output;
  uint local_cc;
  string local_c8;
  EpsCopyOutputStream *local_a8 [2];
  MessageLite *local_98;
  CodedOutputStream local_90;
  StringOutputStream local_40;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_98 = msg;
  io::StringOutputStream::StringOutputStream(&local_40,&local_c8);
  local_90.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_90.impl_.buffer_;
  local_90.impl_.had_error_ = false;
  local_90.impl_.aliasing_enabled_ = false;
  local_90.impl_.skip_check_consistency = false;
  local_90.impl_.end_ = puVar1;
  local_90.impl_.buffer_end_ = puVar1;
  local_90.impl_.stream_ = &local_40.super_ZeroCopyOutputStream;
  local_90.cur_ = puVar1;
  local_90.start_count_ = io::StringOutputStream::ByteCount(&local_40);
  bVar4 = io::StringOutputStream::Next(&local_40,local_a8,(int *)&local_cc);
  if (bVar4 && 0 < (int)local_cc) {
    ppZVar3 = &local_a8[0][-1].stream_;
    if (local_cc < 0x11) {
      ppZVar3 = (ZeroCopyOutputStream **)puVar1;
    }
    local_90.impl_.end_ = (uint8_t *)((long)ppZVar3 + (ulong)local_cc);
    local_90.impl_.buffer_end_ = (uint8_t *)local_a8[0];
    local_90.cur_ = puVar1;
    if (local_cc >= 0x11) {
      local_90.impl_.buffer_end_ = (uint8_t *)(EpsCopyOutputStream *)0x0;
      local_90.cur_ = (uint8_t *)local_a8[0];
    }
  }
  local_cc = CONCAT31(local_cc._1_3_,map_info.key_type_card.data_.data_);
  line = 0x9bc;
  switch(map_info.key_type_card.data_.data_ & 7) {
  case 0:
    uVar2 = ((ulong)map_info & 0xffffffff) >> 3;
    bVar5 = (byte)uVar2 & 7;
    if (bVar5 == 2) {
      bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)&local_cc);
      if (bVar4) {
        WireFormatLite::WriteSInt64(1,(int64_t)node[1].next,&local_90);
      }
      else {
        bVar4 = MapTypeCard::is_signed((MapTypeCard *)&local_cc);
        if (bVar4) {
          WireFormatLite::WriteInt64(1,(int64_t)node[1].next,&local_90);
        }
        else {
          WireFormatLite::WriteUInt64(1,(uint64_t)node[1].next,&local_90);
        }
      }
    }
    else if (bVar5 == 1) {
      bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)&local_cc);
      if (bVar4) {
        WireFormatLite::WriteSInt32(1,*(int32_t *)&node[1].next,&local_90);
      }
      else {
        bVar4 = MapTypeCard::is_signed((MapTypeCard *)&local_cc);
        if (bVar4) {
          WireFormatLite::WriteInt32(1,*(uint32_t *)&node[1].next,&local_90);
        }
        else {
          WireFormatLite::WriteUInt32(1,*(uint32_t *)&node[1].next,&local_90);
        }
      }
    }
    else {
      if ((uVar2 & 7) != 0) {
        line = 0x9a9;
        goto switchD_0029523f_caseD_3;
      }
      WireFormatLite::WriteBool(1,(bool)(*(byte *)&node[1].next & 1),&local_90);
    }
    break;
  case 1:
    WireFormatLite::WriteFixed64(1,(uint64_t)node[1].next,&local_90);
    break;
  case 2:
    bVar5 = (byte)(((ulong)map_info & 0xffffffff) >> 3) & 7;
    if (bVar5 != 3) {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((ulong)bVar5,3,"+type_card.cpp_type() == +MapTypeCard::kString");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x9b6,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
      goto LAB_0029543c;
    }
    WireFormatLite::WriteString(1,(string *)(node + 1),&local_90);
    break;
  default:
switchD_0029523f_caseD_3:
    Unreachable("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                ,line);
  case 5:
    WireFormatLite::WriteFixed32(1,*(uint32_t *)&node[1].next,&local_90);
  }
  if ((map_info._0_4_ >> 0x14 & 1) != 0) {
    WireFormatLite::WriteInt32
              (2,*(int32_t *)((long)&node->next + ((ulong)map_info >> 0x20 & 0xffff)),&local_90);
    io::CodedOutputStream::~CodedOutputStream(&local_90);
    pcVar6 = (*table->fallback)((MessageLite *)0x0,(char *)0x0,(ParseContext *)0x0,(TcFieldData)0x0,
                                (TcParseTableBase *)0x0,0);
    (**(code **)(pcVar6 + 8))(local_98,tag >> 3,local_c8._M_string_length,local_c8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
             ,0x9ca,0x20,"map_info.value_is_validated_enum");
LAB_0029543c:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_a8);
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      uint32_t tag, NodeBase* node,
                                      MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2,
                               *reinterpret_cast<int32_t*>(
                                   node->GetVoidValue(map_info.node_size_info)),
                               &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);
}